

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::StringVector::SerializeWithCachedSizes
          (StringVector *this,CodedOutputStream *output)

{
  int iVar1;
  int size;
  char *data;
  string *value;
  int local_20;
  int n;
  int i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  StringVector *this_local;
  
  local_20 = 0;
  iVar1 = vector_size(this);
  for (; local_20 < iVar1; local_20 = local_20 + 1) {
    vector_abi_cxx11_(this,local_20);
    data = (char *)std::__cxx11::string::data();
    vector_abi_cxx11_(this,local_20);
    size = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (data,size,SERIALIZE,"CoreML.Specification.StringVector.vector");
    value = vector_abi_cxx11_(this,local_20);
    google::protobuf::internal::WireFormatLite::WriteString(1,value,output);
  }
  return;
}

Assistant:

void StringVector::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.StringVector)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated string vector = 1;
  for (int i = 0, n = this->vector_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->vector(i).data(), this->vector(i).length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.StringVector.vector");
    ::google::protobuf::internal::WireFormatLite::WriteString(
      1, this->vector(i), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.StringVector)
}